

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgen.cc
# Opt level: O2

int main(int argc,char **argv)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Grammar *grammar_00;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  FlagsScope flagsScope;
  int argc_local;
  char **argv_local;
  vector<Token,_std::allocator<Token>_> verbatim;
  Grammar *grammar;
  vector<Token,_std::allocator<Token>_> tokens;
  DisposeAST disposeAST;
  string local_418;
  vector<Token,_std::allocator<Token>_> local_3f8;
  Parser local_3d8;
  ofstream out;
  streambuf local_390 [504];
  GenParser gen;
  
  argc_local = argc;
  argv_local = argv;
  std::__cxx11::string::string<std::allocator<char>>((string *)&out,"1.0",(allocator<char> *)&gen);
  gflags::SetVersionString((string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"pgen [options] file",(allocator<char> *)&gen);
  gflags::SetUsageMessage((string *)&out);
  std::__cxx11::string::~string((string *)&out);
  iVar5 = 1;
  gflags::ParseCommandLineFlags(&argc_local,&argv_local,true);
  args = fLS::FLAGS_input_abi_cxx11_;
  sVar3 = fLS::FLAGS_input_abi_cxx11_->_M_string_length;
  if ((sVar3 == 0) && (1 < argc_local)) {
    std::__cxx11::string::assign((char *)fLS::FLAGS_input_abi_cxx11_);
    sVar3 = args->_M_string_length;
  }
  psVar1 = fLS::FLAGS_o_abi_cxx11_;
  if (sVar3 == 0) {
    pcVar6 = "pgen: no input file";
  }
  else {
    if (*(long *)(fLS::FLAGS_o_abi_cxx11_ + 8) != 0) {
      verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      verbatim.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::ifstream::ifstream(&out,(string *)args,_S_in);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&gen);
      std::ostream::operator<<((ostream *)&gen,local_390);
      std::ifstream::close();
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gen);
      std::ifstream::~ifstream(&out);
      Lexer::tokenize(&tokens,&local_418,&verbatim);
      std::__cxx11::string::~string((string *)&local_418);
      std::vector<Token,_std::allocator<Token>_>::vector(&local_3f8,&tokens);
      local_3d8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_3d8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_3d8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_3d8.grammar_ = (Grammar *)0x0;
      local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_3f8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_3d8.yyinvalid = true;
      local_3d8.yytok = 0;
      local_3d8.yydepth = -1;
      local_3d8.yycursor = 0;
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_3f8);
      grammar = (Grammar *)0x0;
      bVar2 = Parser::parse_grammar(&local_3d8,&grammar);
      grammar_00 = grammar;
      if (bVar2) {
        if ((grammar->undef)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::ofstream::ofstream(&out,psVar1,_S_out);
          GenParser::GenParser(&gen,(ostream *)&out);
          GenParser::operator()(&gen,grammar_00,&verbatim);
          disposeAST.super_Visitor._vptr_Visitor = (Visitor)&PTR__Visitor_00134da8;
          ast::DisposeAST::operator()(&disposeAST,&grammar_00->super_Node);
          std::ofstream::~ofstream(&out);
          iVar5 = 0;
        }
      }
      else {
        fmt::v7::print<char[33],std::__cxx11::string&,int&,char>
                  ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                   (char (*) [33])"{0}:{1}: error: unexpected token",args,
                   &tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_start[local_3d8.yycursor].line);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_3d8.tokens);
      std::vector<Token,_std::allocator<Token>_>::~vector(&tokens);
      std::vector<Token,_std::allocator<Token>_>::~vector(&verbatim);
      goto LAB_0010e050;
    }
    pcVar6 = "pgen: no output file";
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar5 = 1;
LAB_0010e050:
  FlagsScope::~FlagsScope(&flagsScope);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  FlagsScope flagsScope;

  gflags::SetVersionString("1.0");
  gflags::SetUsageMessage("pgen [options] file");
  gflags::ParseCommandLineFlags(&argc, &argv, true);

  if (FLAGS_input.empty() && argc > 1) FLAGS_input = argv[1];

  if (FLAGS_input.empty()) {
    std::cerr << "pgen: no input file" << std::endl;
    return EXIT_FAILURE;
  }

  if (FLAGS_o.empty()) {
    std::cerr << "pgen: no output file" << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<Token> verbatim;

  std::vector<Token> tokens = Lexer::tokenize(ReadFile(FLAGS_input), &verbatim);

  Parser parser(tokens);

  ast::Grammar* grammar = nullptr;
  if (!parser.parse_grammar(grammar)) {
    fmt::print(std::cerr, "{0}:{1}: error: unexpected token", FLAGS_input,
               tokens[parser.yycursor].line);
    std::cerr << std::endl;
    return EXIT_FAILURE;
  }

  if (!grammar->undef.empty()) {
    return EXIT_FAILURE;
  }

  std::ofstream out(FLAGS_o);

  GenParser gen(out);
  gen(grammar, verbatim);

  ast::DisposeAST disposeAST;
  disposeAST(grammar);

  return EXIT_SUCCESS;
}